

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O2

mat4f * transposed(mat4f *__return_storage_ptr__,mat4f *a)

{
  vec4f local_48;
  vec4f local_38;
  vec4f local_28;
  vec4f local_18;
  
  local_18.x = *(float *)((long)(a->data + 0) + 0);
  local_18.y = *(float *)((long)(a->data + 0) + 4);
  local_18.z = *(float *)((long)(a->data + 0) + 8);
  local_18.w = *(float *)((long)(a->data + 0) + 0xc);
  local_28.x = *(float *)((long)(a->data + 1) + 0);
  local_28.y = *(float *)((long)(a->data + 1) + 4);
  local_28.z = *(float *)((long)(a->data + 1) + 8);
  local_28.w = *(float *)((long)(a->data + 1) + 0xc);
  local_38.x = *(float *)((long)(a->data + 2) + 0);
  local_38.y = *(float *)((long)(a->data + 2) + 4);
  local_38.z = *(float *)((long)(a->data + 2) + 8);
  local_38.w = *(float *)((long)(a->data + 2) + 0xc);
  local_48.x = *(float *)((long)(a->data + 3) + 0);
  local_48.y = *(float *)((long)(a->data + 3) + 4);
  local_48.z = *(float *)((long)(a->data + 3) + 8);
  local_48.w = *(float *)((long)(a->data + 3) + 0xc);
  mat4f::mat4f(__return_storage_ptr__,&local_18,&local_28,&local_38,&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline mat4f transposed(const mat4f& a) {
	return mat4f(
		vec4f(a[0][0], a[0][1], a[0][2], a[0][3]),
		vec4f(a[1][0], a[1][1], a[1][2], a[1][3]),
		vec4f(a[2][0], a[2][1], a[2][2], a[2][3]),
		vec4f(a[3][0], a[3][1], a[3][2], a[3][3])
	);
}